

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O2

void rw::d3d8::defaultInstanceCB(Geometry *geo,InstanceData *inst)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  bool32 bVar5;
  void *vertexBuffer;
  uint8 *dst;
  uint32 fvf;
  int32 i;
  uint8 *dst_00;
  long lVar6;
  
  uVar4 = geo->flags;
  iVar1 = geo->numTexCoordSets;
  uVar3 = uVar4 >> 1 & 4;
  fvf = (uVar4 & 0x10) + iVar1 * 0x100 + (uVar4 & 8) * 8 + 2;
  iVar2 = uVar3 + iVar1 * 8 + 0x18;
  if ((uVar4 & 0x10) == 0) {
    iVar2 = uVar3 + iVar1 * 8 + 0xc;
  }
  inst->vertexShader = fvf;
  inst->stride = iVar2;
  vertexBuffer = d3d::createVertexBuffer(iVar2 * inst->numVertices,fvf,false);
  inst->vertexBuffer = vertexBuffer;
  inst->managed = '\x01';
  dst = d3d::lockVertices(vertexBuffer,0,0,0);
  instV3d(8,dst,geo->morphTargets->vertices + inst->minVert,inst->numVertices,inst->stride);
  dst_00 = dst + 0xc;
  uVar4 = geo->flags;
  if ((uVar4 & 0x10) != 0) {
    instV3d(8,dst_00,geo->morphTargets->normals + inst->minVert,inst->numVertices,inst->stride);
    dst_00 = dst + 0x18;
    uVar4 = geo->flags;
  }
  inst->vertexAlpha = '\0';
  if ((uVar4 & 8) != 0) {
    bVar5 = instColor(10,dst_00,geo->colors + inst->minVert,inst->numVertices,inst->stride);
    inst->vertexAlpha = (uint8)bVar5;
    dst_00 = dst_00 + 4;
  }
  for (lVar6 = 0; lVar6 < geo->numTexCoordSets; lVar6 = lVar6 + 1) {
    instTexCoords(7,dst_00,geo->texCoords[lVar6] + inst->minVert,inst->numVertices,inst->stride);
    dst_00 = dst_00 + 8;
  }
  d3d::unlockVertices(inst->vertexBuffer);
  return;
}

Assistant:

void
defaultInstanceCB(Geometry *geo, InstanceData *inst)
{
	inst->vertexShader = makeFVFDeclaration(geo->flags, geo->numTexCoordSets);
	inst->stride = getStride(geo->flags, geo->numTexCoordSets);

	assert(inst->vertexBuffer == nil);
	inst->vertexBuffer = createVertexBuffer(inst->numVertices*inst->stride,
	                                              inst->vertexShader, false);
	inst->managed = 1;

	uint8 *dst = lockVertices(inst->vertexBuffer, 0, 0, D3DLOCK_NOSYSLOCK);
	instV3d(VERT_FLOAT3, dst,
		&geo->morphTargets[0].vertices[inst->minVert],
		inst->numVertices, inst->stride);
	dst += 12;

	if(geo->flags & Geometry::NORMALS){
		instV3d(VERT_FLOAT3, dst,
		        &geo->morphTargets[0].normals[inst->minVert],
		        inst->numVertices, inst->stride);
		dst += 12;
	}

	inst->vertexAlpha = 0;
	if(geo->flags & Geometry::PRELIT){
		inst->vertexAlpha = instColor(VERT_ARGB, dst, &geo->colors[inst->minVert],
		                              inst->numVertices, inst->stride);
		dst += 4;
	}

	for(int32 i = 0; i < geo->numTexCoordSets; i++){
		instTexCoords(VERT_FLOAT2, dst, &geo->texCoords[i][inst->minVert],
		        inst->numVertices, inst->stride);
		dst += 8;
	}
	unlockVertices(inst->vertexBuffer);
}